

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_OpdatasetGetPending_Test::~InterpreterTestSuite_PC_OpdatasetGetPending_Test
          (InterpreterTestSuite_PC_OpdatasetGetPending_Test *this)

{
  InterpreterTestSuite_PC_OpdatasetGetPending_Test *this_local;
  
  ~InterpreterTestSuite_PC_OpdatasetGetPending_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_OpdatasetGetPending)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetPendingDataset(_, _)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("opdataset get pending");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}